

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

bool vkt::api::anon_unknown_0::comparePixelToDepthClearValue
               (ConstPixelBufferAccess *access,int x,int y,float ref,string *stringResult)

{
  int iVar1;
  TextureFormat *baseFormat;
  int *piVar2;
  ostream *poVar3;
  float fVar4;
  string local_3e8 [32];
  stringstream local_3c8 [8];
  stringstream s_1;
  ostream local_3b8 [376];
  Float<unsigned_int,_8,_23,_127,_3U> local_240;
  float local_23c;
  byte local_235;
  float floatThreshold;
  undefined1 local_230 [3];
  bool result_1;
  int threshold_1;
  int local_220;
  float local_21c;
  int mantissaBits;
  float depth_1;
  stringstream local_1e8 [8];
  stringstream s;
  ostream local_1d8 [383];
  byte local_59;
  float local_58;
  float fStack_54;
  bool result;
  float threshold;
  float depth;
  int local_40;
  TextureChannelClass local_3c;
  int bitDepth;
  TextureChannelClass channelClass;
  TextureFormat format;
  string *stringResult_local;
  float ref_local;
  int y_local;
  int x_local;
  ConstPixelBufferAccess *access_local;
  
  format = (TextureFormat)stringResult;
  baseFormat = tcu::ConstPixelBufferAccess::getFormat(access);
  _bitDepth = tcu::getEffectiveDepthStencilTextureFormat(baseFormat,MODE_DEPTH);
  local_3c = tcu::getTextureChannelClass(channelClass);
  if (local_3c < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    tcu::getTextureFormatBitDepth((tcu *)&threshold,(TextureFormat *)&bitDepth);
    piVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&threshold);
    local_40 = *piVar2;
    fStack_54 = tcu::ConstPixelBufferAccess::getPixDepth(access,x,y,0);
    local_58 = 2.0 / (float)((1 << ((byte)local_40 & 0x1f)) + -1);
    fVar4 = deFloatAbs(fStack_54 - ref);
    local_59 = fVar4 <= local_58;
    if (!(bool)local_59) {
      std::__cxx11::stringstream::stringstream(local_1e8);
      poVar3 = std::operator<<(local_1d8,"Ref:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,ref);
      poVar3 = std::operator<<(poVar3," Threshold:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_58);
      poVar3 = std::operator<<(poVar3," Depth:");
      std::ostream::operator<<(poVar3,fStack_54);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)format,(string *)&mantissaBits);
      std::__cxx11::string::~string((string *)&mantissaBits);
      std::__cxx11::stringstream::~stringstream(local_1e8);
    }
    access_local._7_1_ = (bool)(local_59 & 1);
  }
  else if (local_3c == TEXTURECHANNELCLASS_FLOATING_POINT) {
    local_21c = tcu::ConstPixelBufferAccess::getPixDepth(access,x,y,0);
    tcu::getTextureFormatMantissaBitDepth((tcu *)local_230,(TextureFormat *)&bitDepth);
    piVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_230);
    local_220 = *piVar2;
    floatThreshold = (float)(10 << (0x17U - (char)local_220 & 0x1f));
    iVar1 = calcFloatDiff(local_21c,ref);
    local_235 = iVar1 <= (int)floatThreshold;
    if (!(bool)local_235) {
      tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_240,(StorageType)floatThreshold);
      local_23c = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_240);
      std::__cxx11::stringstream::stringstream(local_3c8);
      poVar3 = std::operator<<(local_3b8,"Ref:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,ref);
      poVar3 = std::operator<<(poVar3," Threshold:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_23c);
      poVar3 = std::operator<<(poVar3," Depth:");
      std::ostream::operator<<(poVar3,local_21c);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)format,local_3e8);
      std::__cxx11::string::~string(local_3e8);
      std::__cxx11::stringstream::~stringstream(local_3c8);
    }
    access_local._7_1_ = (bool)(local_235 & 1);
  }
  else {
    access_local._7_1_ = false;
  }
  return access_local._7_1_;
}

Assistant:

bool comparePixelToDepthClearValue (const ConstPixelBufferAccess&	access,
									int								x,
									int								y,
									float							ref,
									std::string&					stringResult)
{
	const TextureFormat			format			= getEffectiveDepthStencilTextureFormat(access.getFormat(), Sampler::MODE_DEPTH);
	const TextureChannelClass	channelClass	= getTextureChannelClass(format.type);

	switch (channelClass)
	{
		case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
		case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		{
			const int	bitDepth	= getTextureFormatBitDepth(format).x();
			const float	depth		= access.getPixDepth(x, y);
			const float	threshold	= 2.0f / (float)((1 << bitDepth) - 1);
			const bool	result		= deFloatAbs(depth - ref) <= threshold;

			if (!result)
			{
				std::stringstream s;
				s << "Ref:" << ref << " Threshold:" << threshold << " Depth:" << depth;
				stringResult	= s.str();
			}

			return result;
		}

		case TEXTURECHANNELCLASS_FLOATING_POINT:
		{
			const float	depth			= access.getPixDepth(x, y);
			const int	mantissaBits	= getTextureFormatMantissaBitDepth(format).x();
			const int	threshold		= 10 * 1 << (23 - mantissaBits);

			DE_ASSERT(mantissaBits <= 23);

			const bool	result			= calcFloatDiff(depth, ref) <= threshold;

			if (!result)
			{
				float				floatThreshold	= Float32((deUint32)threshold).asFloat();
				std::stringstream	s;

				s << "Ref:" << ref << " Threshold:" << floatThreshold << " Depth:" << depth;
				stringResult	= s.str();
			}

			return result;
		}

		default:
			DE_FATAL("Invalid channel class");
			return false;
	}
}